

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

void qpdf_oh_set_array_item(qpdf_data qpdf,qpdf_oh oh,int at,qpdf_oh item)

{
  anon_class_16_3_03738134 local_50;
  function<void_(QPDFObjectHandle_&)> local_40;
  qpdf_oh local_1c;
  int local_18;
  qpdf_oh item_local;
  int at_local;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_50.qpdf = qpdf;
  local_50.at = at;
  local_50.item = item;
  local_1c = item;
  local_18 = at;
  item_local = oh;
  _at_local = qpdf;
  std::function<void(QPDFObjectHandle&)>::function<qpdf_oh_set_array_item::__0,void>
            ((function<void(QPDFObjectHandle&)> *)&local_40,&local_50);
  do_with_oh_void(qpdf,oh,&local_40);
  std::function<void_(QPDFObjectHandle_&)>::~function(&local_40);
  return;
}

Assistant:

void
qpdf_oh_set_array_item(qpdf_data qpdf, qpdf_oh oh, int at, qpdf_oh item)
{
    do_with_oh_void(qpdf, oh, [qpdf, at, item](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_set_array_item");
        o.setArrayItem(at, qpdf_oh_item_internal(qpdf, item));
    });
}